

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoMode.cpp
# Opt level: O0

bool sf::operator<(VideoMode *left,VideoMode *right)

{
  VideoMode *right_local;
  VideoMode *left_local;
  bool local_1;
  
  if (left->bitsPerPixel == right->bitsPerPixel) {
    if (left->width == right->width) {
      local_1 = left->height < right->height;
    }
    else {
      local_1 = left->width < right->width;
    }
  }
  else {
    local_1 = left->bitsPerPixel < right->bitsPerPixel;
  }
  return local_1;
}

Assistant:

bool operator <(const VideoMode& left, const VideoMode& right)
{
    if (left.bitsPerPixel == right.bitsPerPixel)
    {
        if (left.width == right.width)
        {
            return left.height < right.height;
        }
        else
        {
            return left.width < right.width;
        }
    }
    else
    {
        return left.bitsPerPixel < right.bitsPerPixel;
    }
}